

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O0

void do_sat_addsub_64(TCGContext_conflict1 *tcg_ctx,TCGv_i64 reg,TCGv_i64 val,_Bool u,_Bool d)

{
  TCGv_i64 ret;
  TCGv_i64 ret_00;
  undefined8 local_40;
  TCGv_i64 t2;
  TCGv_i64 t1;
  TCGv_i64 t0;
  _Bool d_local;
  _Bool u_local;
  TCGv_i64 val_local;
  TCGv_i64 reg_local;
  TCGContext_conflict1 *tcg_ctx_local;
  
  ret = tcg_temp_new_i64(tcg_ctx);
  ret_00 = tcg_temp_new_i64(tcg_ctx);
  if (u) {
    if (d) {
      tcg_gen_sub_i64(tcg_ctx,ret,reg,val);
      tcg_gen_movi_i64_aarch64(tcg_ctx,ret_00,0);
      tcg_gen_movcond_i64_aarch64(tcg_ctx,TCG_COND_LTU,reg,reg,val,ret_00,ret);
    }
    else {
      tcg_gen_add_i64(tcg_ctx,ret,reg,val);
      tcg_gen_movi_i64_aarch64(tcg_ctx,ret_00,-1);
      tcg_gen_movcond_i64_aarch64(tcg_ctx,TCG_COND_LTU,reg,ret,reg,ret_00,ret);
    }
  }
  else {
    if (d) {
      tcg_gen_xor_i64_aarch64(tcg_ctx,ret,reg,val);
      tcg_gen_sub_i64(tcg_ctx,ret_00,reg,val);
      tcg_gen_xor_i64_aarch64(tcg_ctx,reg,reg,ret_00);
      tcg_gen_and_i64_aarch64(tcg_ctx,ret,ret,reg);
      tcg_gen_movi_i64_aarch64(tcg_ctx,reg,-0x8000000000000000);
      local_40 = tcg_const_i64_aarch64(tcg_ctx,0);
      tcg_gen_movcond_i64_aarch64(tcg_ctx,TCG_COND_LT,reg,ret,local_40,reg,ret_00);
    }
    else {
      tcg_gen_xor_i64_aarch64(tcg_ctx,ret,reg,val);
      tcg_gen_add_i64(tcg_ctx,reg,reg,val);
      tcg_gen_xor_i64_aarch64(tcg_ctx,ret_00,reg,val);
      tcg_gen_andc_i64_aarch64(tcg_ctx,ret,ret_00,ret);
      tcg_gen_movi_i64_aarch64(tcg_ctx,ret_00,0x7fffffffffffffff);
      local_40 = tcg_const_i64_aarch64(tcg_ctx,0);
      tcg_gen_movcond_i64_aarch64(tcg_ctx,TCG_COND_LT,reg,ret,local_40,ret_00,reg);
    }
    tcg_temp_free_i64(tcg_ctx,local_40);
  }
  tcg_temp_free_i64(tcg_ctx,ret);
  tcg_temp_free_i64(tcg_ctx,ret_00);
  return;
}

Assistant:

static void do_sat_addsub_64(TCGContext *tcg_ctx, TCGv_i64 reg, TCGv_i64 val, bool u, bool d)
{
    TCGv_i64 t0 = tcg_temp_new_i64(tcg_ctx);
    TCGv_i64 t1 = tcg_temp_new_i64(tcg_ctx);
    TCGv_i64 t2;

    if (u) {
        if (d) {
            tcg_gen_sub_i64(tcg_ctx, t0, reg, val);
            tcg_gen_movi_i64(tcg_ctx, t1, 0);
            tcg_gen_movcond_i64(tcg_ctx, TCG_COND_LTU, reg, reg, val, t1, t0);
        } else {
            tcg_gen_add_i64(tcg_ctx, t0, reg, val);
            tcg_gen_movi_i64(tcg_ctx, t1, -1);
            tcg_gen_movcond_i64(tcg_ctx, TCG_COND_LTU, reg, t0, reg, t1, t0);
        }
    } else {
        if (d) {
            /* Detect signed overflow for subtraction.  */
            tcg_gen_xor_i64(tcg_ctx, t0, reg, val);
            tcg_gen_sub_i64(tcg_ctx, t1, reg, val);
            tcg_gen_xor_i64(tcg_ctx, reg, reg, t1);
            tcg_gen_and_i64(tcg_ctx, t0, t0, reg);

            /* Bound the result.  */
            tcg_gen_movi_i64(tcg_ctx, reg, INT64_MIN);
            t2 = tcg_const_i64(tcg_ctx, 0);
            tcg_gen_movcond_i64(tcg_ctx, TCG_COND_LT, reg, t0, t2, reg, t1);
        } else {
            /* Detect signed overflow for addition.  */
            tcg_gen_xor_i64(tcg_ctx, t0, reg, val);
            tcg_gen_add_i64(tcg_ctx, reg, reg, val);
            tcg_gen_xor_i64(tcg_ctx, t1, reg, val);
            tcg_gen_andc_i64(tcg_ctx, t0, t1, t0);

            /* Bound the result.  */
            tcg_gen_movi_i64(tcg_ctx, t1, INT64_MAX);
            t2 = tcg_const_i64(tcg_ctx, 0);
            tcg_gen_movcond_i64(tcg_ctx, TCG_COND_LT, reg, t0, t2, t1, reg);
        }
        tcg_temp_free_i64(tcg_ctx, t2);
    }
    tcg_temp_free_i64(tcg_ctx, t0);
    tcg_temp_free_i64(tcg_ctx, t1);
}